

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selfguided_avx2.c
# Opt level: O1

int av1_selfguided_restoration_avx2
              (uint8_t *dgd8,int width,int height,int dgd_stride,int32_t *flt0,int32_t *flt1,
              int flt_stride,int sgr_params_idx,int bit_depth,int highbd)

{
  void *__s;
  int32_t iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  int iVar5;
  void *memblk;
  long lVar6;
  ulong uVar7;
  long lVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  void *pvVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  undefined1 (*pauVar19) [32];
  long lVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  uint8_t *puVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [64];
  undefined1 auVar35 [32];
  undefined1 auVar36 [64];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  __m128i shift_a;
  __m128i shift_b;
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  __m256i mask [8];
  int32_t *local_168;
  undefined1 local_160 [304];
  
  memblk = aom_memalign(0x20,0x1fa80);
  if (memblk == (void *)0x0) {
    iVar21 = -1;
  }
  else {
    uVar4 = width + 0x1dU & 0xfffffff8;
    pvVar13 = (void *)((long)memblk + 0xfd5c);
    __s = (void *)((long)memblk + 0x17bfc);
    lVar6 = (long)(int)uVar4;
    puVar25 = dgd8 + (dgd_stride * -3 + -3);
    uVar10 = width + 0xe;
    uVar24 = (ulong)(int)uVar10;
    if (highbd == 0) {
      uVar14 = uVar24 & 0xffffffe0;
      if (uVar14 == 0) {
        uVar7 = 0;
      }
      else {
        memset(pvVar13,0,uVar14 * 4);
        uVar7 = uVar14;
      }
      uVar12 = (ulong)(uVar10 & 0xfffffff8);
      if (uVar7 < uVar12) {
        memset((void *)((long)pvVar13 + uVar7 * 4),0,
               (~uVar7 + uVar12 & 0xfffffffffffffff8) * 4 + 0x20);
        uVar7 = (ulong)((int)uVar7 + ((uint)(~uVar7 + uVar12) & 0xfffffff8) + 8);
      }
      if (uVar7 < uVar24) {
        uVar11 = (uint)uVar7;
        do {
          uVar11 = uVar11 + 1;
          *(undefined4 *)((long)pvVar13 + uVar7 * 4) = 0;
          uVar7 = (ulong)uVar11;
        } while (uVar11 < uVar24);
      }
      if (uVar14 == 0) {
        uVar14 = 0;
      }
      else {
        memset(__s,0,uVar14 * 4);
      }
      if ((uint)uVar14 < (uVar10 & 0xfffffff8)) {
        memset((void *)((long)__s + uVar14 * 4),0,(uVar12 + ~uVar14 & 0xfffffffffffffff8) * 4 + 0x20
              );
        uVar14 = (ulong)((uint)uVar14 + ((uint)(uVar12 + ~uVar14) & 0xfffffff8) + 8);
      }
      if (uVar14 < uVar24) {
        uVar10 = (uint)uVar14;
        do {
          uVar10 = uVar10 + 1;
          *(undefined4 *)((long)__s + uVar14 * 4) = 0;
          uVar14 = (ulong)uVar10;
        } while (uVar14 < uVar24);
      }
      if (-6 < height) {
        lVar26 = (long)memblk + lVar6 * 4 + 0x17c00;
        lVar17 = (long)memblk + 0x17c00;
        uVar24 = 0;
        do {
          uVar24 = uVar24 + 1;
          *(undefined4 *)((long)__s + uVar24 * lVar6 * 4) = 0;
          *(undefined4 *)((long)pvVar13 + uVar24 * lVar6 * 4) = 0;
          if (-6 < width) {
            auVar34 = ZEXT1664((undefined1  [16])0x0);
            lVar18 = 0;
            auVar36 = ZEXT1664((undefined1  [16])0x0);
            do {
              auVar32 = *(undefined1 (*) [32])(lVar17 + lVar18 * 4);
              auVar53 = *(undefined1 (*) [32])(lVar17 + -0x7ea0 + lVar18 * 4);
              auVar2._8_8_ = 0;
              auVar2._0_8_ = *(ulong *)(puVar25 + lVar18);
              auVar39 = vpmovzxbd_avx2(auVar2);
              auVar40 = vpmaddwd_avx2(auVar39,auVar39);
              auVar42 = vpslldq_avx2(auVar39,4);
              auVar39 = vpaddd_avx2(auVar42,auVar39);
              auVar42 = vpslldq_avx2(auVar39,8);
              auVar39 = vpaddd_avx2(auVar39,auVar42);
              auVar2 = vpshufd_avx(auVar39._0_16_,0xff);
              auVar49._16_16_ = ZEXT116(1) * auVar2;
              auVar49._0_16_ = ZEXT116(0) * auVar2;
              auVar42 = vpslldq_avx2(auVar40,4);
              auVar40 = vpaddd_avx2(auVar42,auVar40);
              auVar42 = vpslldq_avx2(auVar40,8);
              auVar40 = vpaddd_avx2(auVar42,auVar40);
              auVar2 = vpshufd_avx(auVar40._0_16_,0xff);
              auVar50._16_16_ = ZEXT116(1) * auVar2;
              auVar50._0_16_ = ZEXT116(0) * auVar2;
              auVar42 = vpaddd_avx2(auVar32,auVar34._0_32_);
              auVar39 = vpaddd_avx2(auVar42,auVar39);
              auVar39 = vpaddd_avx2(auVar39,auVar49);
              auVar42 = vpaddd_avx2(auVar53,auVar36._0_32_);
              auVar40 = vpaddd_avx2(auVar42,auVar40);
              auVar40 = vpaddd_avx2(auVar50,auVar40);
              *(undefined1 (*) [32])(lVar26 + lVar18 * 4) = auVar39;
              *(undefined1 (*) [32])(lVar26 + -0x7ea0 + lVar18 * 4) = auVar40;
              auVar32 = vpsubd_avx2(auVar39,auVar32);
              auVar32 = vpshufd_avx2(auVar32,0xff);
              auVar32 = vpermq_avx2(auVar32,0xaa);
              auVar34 = ZEXT3264(auVar32);
              auVar32 = vpsubd_avx2(auVar40,auVar53);
              auVar32 = vpshufd_avx2(auVar32,0xff);
              auVar32 = vpermq_avx2(auVar32,0xaa);
              auVar36 = ZEXT3264(auVar32);
              lVar18 = lVar18 + 8;
            } while (lVar18 < width + 6);
          }
          puVar25 = puVar25 + dgd_stride;
          lVar26 = lVar26 + lVar6 * 4;
          lVar17 = lVar17 + lVar6 * 4;
        } while (uVar24 != height + 6U);
      }
    }
    else {
      uVar14 = uVar24 & 0xffffffe0;
      if (uVar14 == 0) {
        uVar7 = 0;
      }
      else {
        memset(pvVar13,0,uVar14 * 4);
        uVar7 = uVar14;
      }
      uVar12 = (ulong)(uVar10 & 0xfffffff8);
      if (uVar7 < uVar12) {
        memset((void *)((long)pvVar13 + uVar7 * 4),0,
               (~uVar7 + uVar12 & 0xfffffffffffffff8) * 4 + 0x20);
        uVar7 = (ulong)((int)uVar7 + ((uint)(~uVar7 + uVar12) & 0xfffffff8) + 8);
      }
      if (uVar7 < uVar24) {
        uVar11 = (uint)uVar7;
        do {
          uVar11 = uVar11 + 1;
          *(undefined4 *)((long)pvVar13 + uVar7 * 4) = 0;
          uVar7 = (ulong)uVar11;
        } while (uVar11 < uVar24);
      }
      if (uVar14 == 0) {
        uVar14 = 0;
      }
      else {
        memset(__s,0,uVar14 * 4);
      }
      if ((uint)uVar14 < (uVar10 & 0xfffffff8)) {
        memset((void *)((long)__s + uVar14 * 4),0,(uVar12 + ~uVar14 & 0xfffffffffffffff8) * 4 + 0x20
              );
        uVar14 = (ulong)((uint)uVar14 + ((uint)(uVar12 + ~uVar14) & 0xfffffff8) + 8);
      }
      if (uVar14 < uVar24) {
        uVar10 = (uint)uVar14;
        do {
          uVar10 = uVar10 + 1;
          *(undefined4 *)((long)__s + uVar14 * 4) = 0;
          uVar14 = (ulong)uVar10;
        } while (uVar14 < uVar24);
      }
      if (-6 < height) {
        lVar26 = (long)puVar25 * 2;
        lVar17 = (long)memblk + lVar6 * 4 + 0x17c00;
        lVar18 = (long)memblk + 0x17c00;
        uVar24 = 0;
        do {
          uVar24 = uVar24 + 1;
          *(undefined4 *)((long)__s + uVar24 * lVar6 * 4) = 0;
          *(undefined4 *)((long)pvVar13 + uVar24 * lVar6 * 4) = 0;
          if (-6 < width) {
            auVar34 = ZEXT1664((undefined1  [16])0x0);
            lVar23 = 0;
            auVar36 = ZEXT1664((undefined1  [16])0x0);
            do {
              auVar32 = *(undefined1 (*) [32])(lVar18 + lVar23 * 4);
              auVar53 = *(undefined1 (*) [32])(lVar18 + -0x7ea0 + lVar23 * 4);
              auVar39 = vpmovzxwd_avx2(*(undefined1 (*) [16])(lVar26 + lVar23 * 2));
              auVar40 = vpmaddwd_avx2(auVar39,auVar39);
              auVar42 = vpslldq_avx2(auVar39,4);
              auVar39 = vpaddd_avx2(auVar42,auVar39);
              auVar42 = vpslldq_avx2(auVar39,8);
              auVar39 = vpaddd_avx2(auVar39,auVar42);
              auVar2 = vpshufd_avx(auVar39._0_16_,0xff);
              auVar43._16_16_ = ZEXT116(1) * auVar2;
              auVar43._0_16_ = ZEXT116(0) * auVar2;
              auVar42 = vpslldq_avx2(auVar40,4);
              auVar40 = vpaddd_avx2(auVar42,auVar40);
              auVar42 = vpslldq_avx2(auVar40,8);
              auVar40 = vpaddd_avx2(auVar42,auVar40);
              auVar2 = vpshufd_avx(auVar40._0_16_,0xff);
              auVar46._16_16_ = ZEXT116(1) * auVar2;
              auVar46._0_16_ = ZEXT116(0) * auVar2;
              auVar42 = vpaddd_avx2(auVar32,auVar34._0_32_);
              auVar39 = vpaddd_avx2(auVar42,auVar39);
              auVar39 = vpaddd_avx2(auVar39,auVar43);
              auVar42 = vpaddd_avx2(auVar53,auVar36._0_32_);
              auVar40 = vpaddd_avx2(auVar42,auVar40);
              auVar40 = vpaddd_avx2(auVar46,auVar40);
              *(undefined1 (*) [32])(lVar17 + lVar23 * 4) = auVar39;
              *(undefined1 (*) [32])(lVar17 + -0x7ea0 + lVar23 * 4) = auVar40;
              auVar32 = vpsubd_avx2(auVar39,auVar32);
              auVar32 = vpshufd_avx2(auVar32,0xff);
              auVar32 = vpermq_avx2(auVar32,0xaa);
              auVar34 = ZEXT3264(auVar32);
              auVar32 = vpsubd_avx2(auVar40,auVar53);
              auVar32 = vpshufd_avx2(auVar32,0xff);
              auVar32 = vpermq_avx2(auVar32,0xaa);
              auVar36 = ZEXT3264(auVar32);
              lVar23 = lVar23 + 8;
            } while (lVar23 < width + 6);
          }
          lVar26 = lVar26 + (long)dgd_stride * 2;
          lVar17 = lVar17 + lVar6 * 4;
          lVar18 = lVar18 + lVar6 * 4;
        } while (uVar24 != height + 6U);
      }
    }
    lVar26 = (long)sgr_params_idx;
    uVar10 = av1_sgr_params[lVar26].r[0];
    lVar18 = (long)width;
    lVar17 = (long)(int)(uVar4 * 3);
    bVar9 = (byte)highbd;
    if (0 < (int)uVar10) {
      iVar5 = uVar10 * 2 + 1;
      iVar5 = iVar5 * iVar5;
      iVar21 = av1_sgr_params[lVar26].s[0];
      iVar1 = av1_one_by_x[iVar5 - 1];
      lVar23 = 0x40;
      pauVar19 = (undefined1 (*) [32])local_160;
      auVar2 = vpmovsxbq_avx(ZEXT216(0xff));
      do {
        auVar3 = vpsrlq_avx(auVar2,ZEXT416((uint)lVar23));
        auVar32 = vpmovsxbd_avx2(auVar3);
        *pauVar19 = auVar32;
        pauVar19 = pauVar19 + 1;
        lVar23 = lVar23 + -8;
      } while (lVar23 != 0);
      if (-2 < height) {
        auVar32._4_4_ = iVar21;
        auVar32._0_4_ = iVar21;
        auVar32._8_4_ = iVar21;
        auVar32._12_4_ = iVar21;
        auVar32._16_4_ = iVar21;
        auVar32._20_4_ = iVar21;
        auVar32._24_4_ = iVar21;
        auVar32._28_4_ = iVar21;
        auVar53._4_4_ = iVar1;
        auVar53._0_4_ = iVar1;
        auVar53._8_4_ = iVar1;
        auVar53._12_4_ = iVar1;
        auVar53._16_4_ = iVar1;
        auVar53._20_4_ = iVar1;
        auVar53._24_4_ = iVar1;
        auVar53._28_4_ = iVar1;
        lVar27 = (long)(int)((uVar10 + 1) * uVar4);
        auVar39._4_4_ = iVar5;
        auVar39._0_4_ = iVar5;
        auVar39._8_4_ = iVar5;
        auVar39._12_4_ = iVar5;
        auVar39._16_4_ = iVar5;
        auVar39._20_4_ = iVar5;
        auVar39._24_4_ = iVar5;
        auVar39._28_4_ = iVar5;
        uVar11 = bit_depth * 2 - 0x10;
        uVar15 = (uint)(1 << ((byte)uVar11 & 0x1f)) >> 1;
        auVar40._4_4_ = uVar15;
        auVar40._0_4_ = uVar15;
        auVar40._8_4_ = uVar15;
        auVar40._12_4_ = uVar15;
        auVar40._16_4_ = uVar15;
        auVar40._20_4_ = uVar15;
        auVar40._24_4_ = uVar15;
        auVar40._28_4_ = uVar15;
        iVar21 = (1 << ((byte)(bit_depth - 8U) & 0x1f)) >> 1;
        auVar42._4_4_ = iVar21;
        auVar42._0_4_ = iVar21;
        auVar42._8_4_ = iVar21;
        auVar42._12_4_ = iVar21;
        auVar42._16_4_ = iVar21;
        auVar42._20_4_ = iVar21;
        auVar42._24_4_ = iVar21;
        auVar42._28_4_ = iVar21;
        pvVar13 = (void *)((long)memblk + lVar17 * 4);
        lVar16 = lVar6 * 8;
        lVar23 = lVar17 * 4 + (long)(int)(uVar10 * uVar4) * 4;
        lVar20 = (long)memblk + lVar23 + (ulong)uVar10 * 4 + 0xfd68;
        lVar22 = (long)memblk + (ulong)uVar10 * 4 + lVar17 * 4 + lVar27 * -4 + 0xfd68;
        lVar23 = (long)memblk + lVar23 + (long)(int)~uVar10 * 4 + 0xfd68;
        lVar27 = (long)memblk + (long)(int)~uVar10 * 4 + lVar17 * 4 + lVar27 * -4 + 0xfd68;
        auVar44._8_4_ = 0x80000;
        auVar44._0_8_ = 0x8000000080000;
        auVar44._12_4_ = 0x80000;
        auVar44._16_4_ = 0x80000;
        auVar44._20_4_ = 0x80000;
        auVar44._24_4_ = 0x80000;
        auVar44._28_4_ = 0x80000;
        lVar28 = -1;
        auVar47._8_4_ = 0xff;
        auVar47._0_8_ = 0xff000000ff;
        auVar47._12_4_ = 0xff;
        auVar47._16_4_ = 0xff;
        auVar47._20_4_ = 0xff;
        auVar47._24_4_ = 0xff;
        auVar47._28_4_ = 0xff;
        do {
          if (-2 < width) {
            lVar8 = -1;
            iVar21 = width + 2;
            do {
              auVar49 = vpaddd_avx2(*(undefined1 (*) [32])(lVar22 + 0x7ea4 + lVar8 * 4),
                                    *(undefined1 (*) [32])(lVar23 + 0x7ea4 + lVar8 * 4));
              auVar49 = vpsubd_avx2(*(undefined1 (*) [32])(lVar27 + 0x7ea4 + lVar8 * 4),auVar49);
              auVar49 = vpaddd_avx2(auVar49,*(undefined1 (*) [32])(lVar20 + 0x7ea4 + lVar8 * 4));
              auVar50 = vpaddd_avx2(*(undefined1 (*) [32])(lVar22 + 4 + lVar8 * 4),
                                    *(undefined1 (*) [32])(lVar23 + 4 + lVar8 * 4));
              auVar50 = vpsubd_avx2(*(undefined1 (*) [32])(lVar27 + 4 + lVar8 * 4),auVar50);
              auVar50 = vpaddd_avx2(auVar50,*(undefined1 (*) [32])(lVar20 + 4 + lVar8 * 4));
              if (iVar21 < 8) {
                auVar49 = vpand_avx2(*(undefined1 (*) [32])(local_160 + (long)iVar21 * 0x20),auVar49
                                    );
                auVar50 = vpand_avx2(auVar50,*(undefined1 (*) [32])(local_160 + (long)iVar21 * 0x20)
                                    );
              }
              if (bit_depth < 9) {
                auVar43 = vpmaddwd_avx2(auVar49,auVar49);
                auVar50 = vpmulld_avx2(auVar50,auVar39);
              }
              else {
                auVar50 = vpaddd_avx2(auVar50,auVar40);
                auVar46 = vpsrld_avx2(auVar50,ZEXT416(uVar11));
                auVar50 = vpaddd_avx2(auVar49,auVar42);
                auVar50 = vpsrld_avx2(auVar50,ZEXT416(bit_depth - 8U));
                auVar43 = vpmaddwd_avx2(auVar50,auVar50);
                auVar50 = vpmulld_avx2(auVar46,auVar39);
                auVar50 = vpmaxsd_avx2(auVar50,auVar43);
              }
              auVar50 = vpsubd_avx2(auVar50,auVar43);
              auVar50 = vpmulld_avx2(auVar50,auVar32);
              auVar50 = vpaddd_avx2(auVar50,auVar44);
              auVar50 = vpsrld_avx2(auVar50,0x14);
              vpminsd_avx2(auVar50,auVar47);
              auVar50 = vpcmpeqd_avx2(auVar43,auVar43);
              auVar50 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar50);
              auVar51._8_4_ = 0x100;
              auVar51._0_8_ = 0x10000000100;
              auVar51._12_4_ = 0x100;
              auVar51._16_4_ = 0x100;
              auVar51._20_4_ = 0x100;
              auVar51._24_4_ = 0x100;
              auVar51._28_4_ = 0x100;
              *(undefined1 (*) [32])((long)pvVar13 + lVar8 * 4 + 0x2c) = auVar50;
              auVar50 = vpsubd_avx2(auVar51,auVar50);
              auVar50 = vpmaddwd_avx2(auVar50,auVar53);
              auVar49 = vpmulld_avx2(auVar50,auVar49);
              auVar52._8_4_ = 0x800;
              auVar52._0_8_ = 0x80000000800;
              auVar52._12_4_ = 0x800;
              auVar52._16_4_ = 0x800;
              auVar52._20_4_ = 0x800;
              auVar52._24_4_ = 0x800;
              auVar52._28_4_ = 0x800;
              auVar49 = vpaddd_avx2(auVar49,auVar52);
              auVar49 = vpsrld_avx2(auVar49,0xc);
              *(undefined1 (*) [32])((long)pvVar13 + lVar8 * 4 + 0x7ecc) = auVar49;
              lVar8 = lVar8 + 8;
              iVar21 = iVar21 + -8;
            } while (lVar8 <= lVar18);
          }
          lVar28 = lVar28 + 2;
          pvVar13 = (void *)((long)pvVar13 + lVar16);
          lVar20 = lVar20 + lVar16;
          lVar22 = lVar22 + lVar16;
          lVar23 = lVar23 + lVar16;
          lVar27 = lVar27 + lVar16;
        } while (lVar28 <= height);
      }
      puVar25 = (uint8_t *)((long)dgd8 * 2);
      if (highbd == 0) {
        puVar25 = dgd8;
      }
      if (0 < height) {
        lVar23 = lVar6 * 4;
        lVar16 = (long)memblk + lVar6 * 4 + lVar17 * 4 + 0x7ed0;
        lVar22 = (long)memblk + lVar6 * 8 + lVar17 * 4 + 0x7ed0;
        lVar20 = (long)memblk + lVar17 * 4 + 0x7ed0;
        iVar21 = 0;
        auVar29._8_4_ = 0x100;
        auVar29._0_8_ = 0x10000000100;
        auVar29._12_4_ = 0x100;
        auVar29._16_4_ = 0x100;
        auVar29._20_4_ = 0x100;
        auVar29._24_4_ = 0x100;
        auVar29._28_4_ = 0x100;
        uVar24 = 0;
        do {
          if ((uVar24 & 1) == 0) {
            if (0 < width) {
              lVar27 = 0;
              do {
                if (highbd == 0) {
                  auVar32 = vpmovzxbd_avx2(*(undefined1 (*) [16])
                                            (puVar25 + (iVar21 + (int)lVar27 << (bVar9 & 0x1f))));
                }
                else {
                  auVar32 = vpmovzxwd_avx2(*(undefined1 (*) [16])
                                            (puVar25 + (iVar21 + (int)lVar27 << (bVar9 & 0x1f))));
                }
                auVar53 = vpaddd_avx2(*(undefined1 (*) [32])(lVar22 + -0x7ea4 + lVar27 * 4),
                                      *(undefined1 (*) [32])(lVar20 + -0x7ea4 + lVar27 * 4));
                auVar39 = vpaddd_avx2(*(undefined1 (*) [32])(lVar20 + -0x7ea0 + lVar27 * 4),
                                      *(undefined1 (*) [32])(lVar20 + -0x7ea8 + lVar27 * 4));
                auVar39 = vpaddd_avx2(auVar39,*(undefined1 (*) [32])(lVar22 + -0x7ea8 + lVar27 * 4))
                ;
                auVar39 = vpaddd_avx2(auVar39,*(undefined1 (*) [32])(lVar22 + -0x7ea0 + lVar27 * 4))
                ;
                auVar39 = vpaddd_avx2(auVar39,auVar53);
                auVar40 = vpslld_avx2(auVar39,2);
                auVar53 = vpaddd_avx2(auVar39,auVar53);
                auVar53 = vpaddd_avx2(auVar53,auVar40);
                auVar39 = vpmaddwd_avx2(auVar53,auVar32);
                auVar32 = vpaddd_avx2(*(undefined1 (*) [32])(lVar22 + -4 + lVar27 * 4),
                                      *(undefined1 (*) [32])(lVar20 + -4 + lVar27 * 4));
                auVar53 = vpaddd_avx2(*(undefined1 (*) [32])(lVar20 + lVar27 * 4),
                                      *(undefined1 (*) [32])(lVar20 + -8 + lVar27 * 4));
                auVar53 = vpaddd_avx2(auVar53,*(undefined1 (*) [32])(lVar22 + -8 + lVar27 * 4));
                auVar53 = vpaddd_avx2(auVar53,*(undefined1 (*) [32])(lVar22 + lVar27 * 4));
                auVar53 = vpaddd_avx2(auVar53,auVar32);
                auVar40 = vpslld_avx2(auVar53,2);
                auVar53 = vpaddd_avx2(auVar53,auVar40);
                auVar32 = vpaddd_avx2(auVar32,auVar53);
                auVar32 = vpaddd_avx2(auVar32,auVar29);
                auVar32 = vpaddd_avx2(auVar32,auVar39);
                auVar32 = vpsrad_avx2(auVar32,9);
                *(undefined1 (*) [32])(flt0 + lVar27) = auVar32;
                lVar27 = lVar27 + 8;
              } while (lVar27 < lVar18);
            }
          }
          else if (0 < width) {
            lVar27 = 0;
            do {
              if (highbd == 0) {
                auVar32 = vpmovzxbd_avx2(*(undefined1 (*) [16])
                                          (puVar25 + (iVar21 + (int)lVar27 << (bVar9 & 0x1f))));
              }
              else {
                auVar32 = vpmovzxwd_avx2(*(undefined1 (*) [16])
                                          (puVar25 + (iVar21 + (int)lVar27 << (bVar9 & 0x1f))));
              }
              auVar53 = *(undefined1 (*) [32])(lVar16 + -0x7ea4 + lVar27 * 4);
              auVar39 = vpaddd_avx2(auVar53,*(undefined1 (*) [32])(lVar16 + -0x7ea8 + lVar27 * 4));
              auVar39 = vpaddd_avx2(auVar39,*(undefined1 (*) [32])(lVar16 + -0x7ea0 + lVar27 * 4));
              auVar40 = vpslld_avx2(auVar39,2);
              auVar53 = vpaddd_avx2(auVar39,auVar53);
              auVar39 = vpaddd_avx2(auVar53,auVar40);
              auVar53 = *(undefined1 (*) [32])(lVar16 + -4 + lVar27 * 4);
              auVar40 = vpaddd_avx2(auVar53,*(undefined1 (*) [32])(lVar16 + -8 + lVar27 * 4));
              auVar40 = vpaddd_avx2(auVar40,*(undefined1 (*) [32])(lVar16 + lVar27 * 4));
              auVar39 = vpmaddwd_avx2(auVar39,auVar32);
              auVar32 = vpslld_avx2(auVar40,2);
              auVar32 = vpaddd_avx2(auVar40,auVar32);
              auVar32 = vpaddd_avx2(auVar53,auVar32);
              auVar37._8_4_ = 0x80;
              auVar37._0_8_ = 0x8000000080;
              auVar37._12_4_ = 0x80;
              auVar37._16_4_ = 0x80;
              auVar37._20_4_ = 0x80;
              auVar37._24_4_ = 0x80;
              auVar37._28_4_ = 0x80;
              auVar32 = vpaddd_avx2(auVar32,auVar37);
              auVar32 = vpaddd_avx2(auVar32,auVar39);
              auVar32 = vpsrad_avx2(auVar32,8);
              *(undefined1 (*) [32])(flt0 + lVar27) = auVar32;
              lVar27 = lVar27 + 8;
            } while (lVar27 < lVar18);
          }
          uVar24 = uVar24 + 1;
          flt0 = flt0 + flt_stride;
          iVar21 = iVar21 + dgd_stride;
          lVar16 = lVar16 + lVar23;
          lVar22 = lVar22 + lVar23;
          lVar20 = lVar20 + lVar23;
        } while (uVar24 != (uint)height);
      }
    }
    uVar10 = av1_sgr_params[lVar26].r[1];
    if (0 < (int)uVar10) {
      iVar5 = uVar10 * 2 + 1;
      iVar5 = iVar5 * iVar5;
      iVar21 = av1_sgr_params[lVar26].s[1];
      iVar1 = av1_one_by_x[iVar5 - 1];
      lVar26 = 0x40;
      pauVar19 = (undefined1 (*) [32])local_160;
      auVar2 = vpmovsxbq_avx(ZEXT216(0xff));
      do {
        auVar3 = vpsrlq_avx(auVar2,ZEXT416((uint)lVar26));
        auVar32 = vpmovsxbd_avx2(auVar3);
        *pauVar19 = auVar32;
        pauVar19 = pauVar19 + 1;
        lVar26 = lVar26 + -8;
      } while (lVar26 != 0);
      if (-2 < height) {
        auVar30._4_4_ = iVar21;
        auVar30._0_4_ = iVar21;
        auVar30._8_4_ = iVar21;
        auVar30._12_4_ = iVar21;
        auVar30._16_4_ = iVar21;
        auVar30._20_4_ = iVar21;
        auVar30._24_4_ = iVar21;
        auVar30._28_4_ = iVar21;
        auVar33._4_4_ = iVar1;
        auVar33._0_4_ = iVar1;
        auVar33._8_4_ = iVar1;
        auVar33._12_4_ = iVar1;
        auVar33._16_4_ = iVar1;
        auVar33._20_4_ = iVar1;
        auVar33._24_4_ = iVar1;
        auVar33._28_4_ = iVar1;
        lVar16 = (long)(int)((uVar10 + 1) * uVar4);
        auVar35._4_4_ = iVar5;
        auVar35._0_4_ = iVar5;
        auVar35._8_4_ = iVar5;
        auVar35._12_4_ = iVar5;
        auVar35._16_4_ = iVar5;
        auVar35._20_4_ = iVar5;
        auVar35._24_4_ = iVar5;
        auVar35._28_4_ = iVar5;
        uVar11 = bit_depth * 2 - 0x10;
        uVar15 = (uint)(1 << ((byte)uVar11 & 0x1f)) >> 1;
        auVar38._4_4_ = uVar15;
        auVar38._0_4_ = uVar15;
        auVar38._8_4_ = uVar15;
        auVar38._12_4_ = uVar15;
        auVar38._16_4_ = uVar15;
        auVar38._20_4_ = uVar15;
        auVar38._24_4_ = uVar15;
        auVar38._28_4_ = uVar15;
        iVar21 = (1 << ((byte)(bit_depth - 8U) & 0x1f)) >> 1;
        auVar41._4_4_ = iVar21;
        auVar41._0_4_ = iVar21;
        auVar41._8_4_ = iVar21;
        auVar41._12_4_ = iVar21;
        auVar41._16_4_ = iVar21;
        auVar41._20_4_ = iVar21;
        auVar41._24_4_ = iVar21;
        auVar41._28_4_ = iVar21;
        pvVar13 = (void *)((long)memblk + lVar17 * 4);
        lVar23 = lVar6 * 4;
        lVar26 = lVar17 * 4 + (long)(int)(uVar10 * uVar4) * 4;
        lVar20 = (long)memblk + lVar26 + (ulong)uVar10 * 4 + 0xfd68;
        lVar22 = (long)memblk + (ulong)uVar10 * 4 + lVar17 * 4 + lVar16 * -4 + 0xfd68;
        lVar26 = (long)memblk + lVar26 + (long)(int)~uVar10 * 4 + 0xfd68;
        lVar16 = (long)memblk + (long)(int)~uVar10 * 4 + lVar17 * 4 + lVar16 * -4 + 0xfd68;
        auVar45._8_4_ = 0x80000;
        auVar45._0_8_ = 0x8000000080000;
        auVar45._12_4_ = 0x80000;
        auVar45._16_4_ = 0x80000;
        auVar45._20_4_ = 0x80000;
        auVar45._24_4_ = 0x80000;
        auVar45._28_4_ = 0x80000;
        uVar24 = 0xffffffffffffffff;
        auVar48._8_4_ = 0xff;
        auVar48._0_8_ = 0xff000000ff;
        auVar48._12_4_ = 0xff;
        auVar48._16_4_ = 0xff;
        auVar48._20_4_ = 0xff;
        auVar48._24_4_ = 0xff;
        auVar48._28_4_ = 0xff;
        do {
          if (-2 < width) {
            lVar27 = -1;
            iVar21 = width + 2;
            do {
              auVar32 = vpaddd_avx2(*(undefined1 (*) [32])(lVar22 + 0x7ea4 + lVar27 * 4),
                                    *(undefined1 (*) [32])(lVar26 + 0x7ea4 + lVar27 * 4));
              auVar32 = vpsubd_avx2(*(undefined1 (*) [32])(lVar16 + 0x7ea4 + lVar27 * 4),auVar32);
              auVar32 = vpaddd_avx2(auVar32,*(undefined1 (*) [32])(lVar20 + 0x7ea4 + lVar27 * 4));
              auVar53 = vpaddd_avx2(*(undefined1 (*) [32])(lVar22 + 4 + lVar27 * 4),
                                    *(undefined1 (*) [32])(lVar26 + 4 + lVar27 * 4));
              auVar53 = vpsubd_avx2(*(undefined1 (*) [32])(lVar16 + 4 + lVar27 * 4),auVar53);
              auVar53 = vpaddd_avx2(auVar53,*(undefined1 (*) [32])(lVar20 + 4 + lVar27 * 4));
              if (iVar21 < 8) {
                auVar32 = vpand_avx2(*(undefined1 (*) [32])(local_160 + (long)iVar21 * 0x20),auVar32
                                    );
                auVar53 = vpand_avx2(auVar53,*(undefined1 (*) [32])(local_160 + (long)iVar21 * 0x20)
                                    );
              }
              if (bit_depth < 9) {
                auVar39 = vpmaddwd_avx2(auVar32,auVar32);
                auVar53 = vpmulld_avx2(auVar53,auVar35);
              }
              else {
                auVar53 = vpaddd_avx2(auVar53,auVar38);
                auVar40 = vpsrld_avx2(auVar53,ZEXT416(uVar11));
                auVar53 = vpaddd_avx2(auVar32,auVar41);
                auVar53 = vpsrld_avx2(auVar53,ZEXT416(bit_depth - 8U));
                auVar39 = vpmaddwd_avx2(auVar53,auVar53);
                auVar53 = vpmulld_avx2(auVar40,auVar35);
                auVar53 = vpmaxsd_avx2(auVar53,auVar39);
              }
              auVar53 = vpsubd_avx2(auVar53,auVar39);
              auVar53 = vpmulld_avx2(auVar53,auVar30);
              auVar53 = vpaddd_avx2(auVar53,auVar45);
              auVar53 = vpsrld_avx2(auVar53,0x14);
              vpminsd_avx2(auVar53,auVar48);
              auVar53 = vpcmpeqd_avx2(auVar39,auVar39);
              auVar53 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar53);
              auVar54._8_4_ = 0x100;
              auVar54._0_8_ = 0x10000000100;
              auVar54._12_4_ = 0x100;
              auVar54._16_4_ = 0x100;
              auVar54._20_4_ = 0x100;
              auVar54._24_4_ = 0x100;
              auVar54._28_4_ = 0x100;
              *(undefined1 (*) [32])((long)pvVar13 + lVar27 * 4 + 0x2c) = auVar53;
              auVar53 = vpsubd_avx2(auVar54,auVar53);
              auVar53 = vpmaddwd_avx2(auVar53,auVar33);
              auVar32 = vpmulld_avx2(auVar53,auVar32);
              auVar55._8_4_ = 0x800;
              auVar55._0_8_ = 0x80000000800;
              auVar55._12_4_ = 0x800;
              auVar55._16_4_ = 0x800;
              auVar55._20_4_ = 0x800;
              auVar55._24_4_ = 0x800;
              auVar55._28_4_ = 0x800;
              auVar32 = vpaddd_avx2(auVar32,auVar55);
              auVar32 = vpsrld_avx2(auVar32,0xc);
              *(undefined1 (*) [32])((long)pvVar13 + lVar27 * 4 + 0x7ecc) = auVar32;
              lVar27 = lVar27 + 8;
              iVar21 = iVar21 + -8;
            } while (lVar27 <= lVar18);
          }
          uVar24 = uVar24 + 1;
          pvVar13 = (void *)((long)pvVar13 + lVar23);
          lVar20 = lVar20 + lVar23;
          lVar22 = lVar22 + lVar23;
          lVar26 = lVar26 + lVar23;
          lVar16 = lVar16 + lVar23;
        } while (uVar24 != height + 1);
      }
      puVar25 = (uint8_t *)((long)dgd8 * 2);
      if (highbd == 0) {
        puVar25 = dgd8;
      }
      if (0 < height) {
        lVar26 = (long)memblk + lVar6 * 8 + lVar17 * 4 + 0x7ed0;
        lVar23 = (long)memblk + lVar6 * 4 + lVar17 * 4 + 0x7ed0;
        lVar6 = lVar6 * 4;
        lVar17 = (long)memblk + lVar17 * 4 + 0x7ed0;
        iVar21 = 0;
        auVar31._8_4_ = 0x100;
        auVar31._0_8_ = 0x10000000100;
        auVar31._12_4_ = 0x100;
        auVar31._16_4_ = 0x100;
        auVar31._20_4_ = 0x100;
        auVar31._24_4_ = 0x100;
        auVar31._28_4_ = 0x100;
        uVar24 = 0;
        local_168 = flt1;
        do {
          if (0 < width) {
            lVar16 = 0;
            do {
              if (highbd == 0) {
                auVar32 = vpmovzxbd_avx2(*(undefined1 (*) [16])
                                          (puVar25 + (iVar21 + (int)lVar16 << (bVar9 & 0x1f))));
              }
              else {
                auVar32 = vpmovzxwd_avx2(*(undefined1 (*) [16])
                                          (puVar25 + (iVar21 + (int)lVar16 << (bVar9 & 0x1f))));
              }
              auVar53 = vpaddd_avx2(*(undefined1 (*) [32])(lVar17 + -0x7ea0 + lVar16 * 4),
                                    *(undefined1 (*) [32])(lVar17 + -0x7ea8 + lVar16 * 4));
              auVar53 = vpaddd_avx2(auVar53,*(undefined1 (*) [32])(lVar26 + -0x7ea8 + lVar16 * 4));
              auVar53 = vpaddd_avx2(auVar53,*(undefined1 (*) [32])(lVar26 + -0x7ea0 + lVar16 * 4));
              auVar39 = vpaddd_avx2(*(undefined1 (*) [32])(lVar23 + -0x7ea8 + lVar16 * 4),
                                    *(undefined1 (*) [32])(lVar17 + -0x7ea4 + lVar16 * 4));
              auVar39 = vpaddd_avx2(auVar39,*(undefined1 (*) [32])(lVar23 + -0x7ea4 + lVar16 * 4));
              auVar39 = vpaddd_avx2(auVar39,*(undefined1 (*) [32])(lVar23 + -0x7ea0 + lVar16 * 4));
              auVar39 = vpaddd_avx2(auVar39,*(undefined1 (*) [32])(lVar26 + -0x7ea4 + lVar16 * 4));
              auVar39 = vpaddd_avx2(auVar39,auVar53);
              auVar39 = vpslld_avx2(auVar39,2);
              auVar40 = vpsubd_avx2(auVar39,auVar53);
              auVar53 = vpaddd_avx2(*(undefined1 (*) [32])(lVar17 + lVar16 * 4),
                                    *(undefined1 (*) [32])(lVar17 + -8 + lVar16 * 4));
              auVar53 = vpaddd_avx2(auVar53,*(undefined1 (*) [32])(lVar26 + -8 + lVar16 * 4));
              auVar53 = vpaddd_avx2(auVar53,*(undefined1 (*) [32])(lVar26 + lVar16 * 4));
              auVar39 = vpaddd_avx2(*(undefined1 (*) [32])(lVar23 + -8 + lVar16 * 4),
                                    *(undefined1 (*) [32])(lVar17 + -4 + lVar16 * 4));
              auVar39 = vpaddd_avx2(auVar39,*(undefined1 (*) [32])(lVar23 + -4 + lVar16 * 4));
              auVar39 = vpaddd_avx2(auVar39,*(undefined1 (*) [32])(lVar23 + lVar16 * 4));
              auVar40 = vpmaddwd_avx2(auVar40,auVar32);
              auVar32 = vpaddd_avx2(auVar39,*(undefined1 (*) [32])(lVar26 + -4 + lVar16 * 4));
              auVar32 = vpaddd_avx2(auVar32,auVar53);
              auVar32 = vpslld_avx2(auVar32,2);
              auVar32 = vpaddd_avx2(auVar32,auVar31);
              auVar53 = vpsubd_avx2(auVar40,auVar53);
              auVar32 = vpaddd_avx2(auVar53,auVar32);
              auVar32 = vpsrad_avx2(auVar32,9);
              *(undefined1 (*) [32])(local_168 + lVar16) = auVar32;
              lVar16 = lVar16 + 8;
            } while (lVar16 < lVar18);
          }
          uVar24 = uVar24 + 1;
          local_168 = local_168 + flt_stride;
          iVar21 = iVar21 + dgd_stride;
          lVar26 = lVar26 + lVar6;
          lVar23 = lVar23 + lVar6;
          lVar17 = lVar17 + lVar6;
        } while (uVar24 != (uint)height);
      }
    }
    aom_free(memblk);
    iVar21 = 0;
  }
  return iVar21;
}

Assistant:

int av1_selfguided_restoration_avx2(const uint8_t *dgd8, int width, int height,
                                    int dgd_stride, int32_t *flt0,
                                    int32_t *flt1, int flt_stride,
                                    int sgr_params_idx, int bit_depth,
                                    int highbd) {
  // The ALIGN_POWER_OF_TWO macro here ensures that column 1 of Atl, Btl,
  // Ctl and Dtl is 32-byte aligned.
  const int buf_elts = ALIGN_POWER_OF_TWO(RESTORATION_PROC_UNIT_PELS, 3);

  int32_t *buf = aom_memalign(
      32, 4 * sizeof(*buf) * ALIGN_POWER_OF_TWO(RESTORATION_PROC_UNIT_PELS, 3));
  if (!buf) return -1;

  const int width_ext = width + 2 * SGRPROJ_BORDER_HORZ;
  const int height_ext = height + 2 * SGRPROJ_BORDER_VERT;

  // Adjusting the stride of A and B here appears to avoid bad cache effects,
  // leading to a significant speed improvement.
  // We also align the stride to a multiple of 32 bytes for efficiency.
  int buf_stride = ALIGN_POWER_OF_TWO(width_ext + 16, 3);

  // The "tl" pointers point at the top-left of the initialised data for the
  // array.
  int32_t *Atl = buf + 0 * buf_elts + 7;
  int32_t *Btl = buf + 1 * buf_elts + 7;
  int32_t *Ctl = buf + 2 * buf_elts + 7;
  int32_t *Dtl = buf + 3 * buf_elts + 7;

  // The "0" pointers are (- SGRPROJ_BORDER_VERT, -SGRPROJ_BORDER_HORZ). Note
  // there's a zero row and column in A, B (integral images), so we move down
  // and right one for them.
  const int buf_diag_border =
      SGRPROJ_BORDER_HORZ + buf_stride * SGRPROJ_BORDER_VERT;

  int32_t *A0 = Atl + 1 + buf_stride;
  int32_t *B0 = Btl + 1 + buf_stride;
  int32_t *C0 = Ctl + 1 + buf_stride;
  int32_t *D0 = Dtl + 1 + buf_stride;

  // Finally, A, B, C, D point at position (0, 0).
  int32_t *A = A0 + buf_diag_border;
  int32_t *B = B0 + buf_diag_border;
  int32_t *C = C0 + buf_diag_border;
  int32_t *D = D0 + buf_diag_border;

  const int dgd_diag_border =
      SGRPROJ_BORDER_HORZ + dgd_stride * SGRPROJ_BORDER_VERT;
  const uint8_t *dgd0 = dgd8 - dgd_diag_border;

  // Generate integral images from the input. C will contain sums of squares; D
  // will contain just sums
  if (highbd)
    integral_images_highbd(CONVERT_TO_SHORTPTR(dgd0), dgd_stride, width_ext,
                           height_ext, Ctl, Dtl, buf_stride);
  else
    integral_images(dgd0, dgd_stride, width_ext, height_ext, Ctl, Dtl,
                    buf_stride);

  const sgr_params_type *const params = &av1_sgr_params[sgr_params_idx];
  // Write to flt0 and flt1
  // If params->r == 0 we skip the corresponding filter. We only allow one of
  // the radii to be 0, as having both equal to 0 would be equivalent to
  // skipping SGR entirely.
  assert(!(params->r[0] == 0 && params->r[1] == 0));
  assert(params->r[0] < AOMMIN(SGRPROJ_BORDER_VERT, SGRPROJ_BORDER_HORZ));
  assert(params->r[1] < AOMMIN(SGRPROJ_BORDER_VERT, SGRPROJ_BORDER_HORZ));

  if (params->r[0] > 0) {
    calc_ab_fast(A, B, C, D, width, height, buf_stride, bit_depth,
                 sgr_params_idx, 0);
    final_filter_fast(flt0, flt_stride, A, B, buf_stride, dgd8, dgd_stride,
                      width, height, highbd);
  }

  if (params->r[1] > 0) {
    calc_ab(A, B, C, D, width, height, buf_stride, bit_depth, sgr_params_idx,
            1);
    final_filter(flt1, flt_stride, A, B, buf_stride, dgd8, dgd_stride, width,
                 height, highbd);
  }
  aom_free(buf);
  return 0;
}